

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O0

void hexToRev(void *dest,char *src)

{
  octet oVar1;
  long in_RSI;
  octet *in_RDI;
  size_t count;
  size_t local_18;
  char *local_10;
  octet *local_8;
  
  local_18 = strLen((char *)0x11b2b8);
  local_10 = (char *)(in_RSI + local_18);
  local_8 = in_RDI;
  for (; local_18 != 0; local_18 = local_18 - 2) {
    local_10 = local_10 + -2;
    oVar1 = hexToO(local_10);
    *local_8 = oVar1;
    local_8 = local_8 + 1;
  }
  return;
}

Assistant:

void hexToRev(void* dest, const char* src)
{
	size_t count;
	ASSERT(hexIsValid(src));
	ASSERT(memIsDisjoint2(src, strLen(src) + 1, dest, strLen(src) / 2));
	count = strLen(src);
	src = src + count;
	for (; count; count -= 2, dest = (octet*)dest + 1)
		*(octet*)dest = hexToO(src -= 2);
}